

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

bool __thiscall CCollision::IsTile(CCollision *this,int x,int y,int Flag)

{
  uint uVar1;
  uint in_ECX;
  undefined8 in_RDI;
  undefined4 unaff_retaddr;
  
  uVar1 = GetTile((CCollision *)CONCAT44(Flag,unaff_retaddr),(int)((ulong)in_RDI >> 0x20),
                  (int)in_RDI);
  return (uVar1 & in_ECX) != 0;
}

Assistant:

bool CCollision::IsTile(int x, int y, int Flag) const
{
	return GetTile(x, y)&Flag;
}